

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_any.h
# Opt level: O1

void UnitTests::stream_any_details::
     output_range_or_type<std::__cxx11::list<unsigned_int,std::allocator<unsigned_int>>>
               (ostream *s,list<unsigned_int,_std::allocator<unsigned_int>_> *t,true_type *param_3)

{
  _List_node_base *p_Var1;
  _List_const_iterator<unsigned_int> __first;
  
  std::__ostream_insert<char,std::char_traits<char>>(s,"[",1);
  p_Var1 = (t->super__List_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl._M_node.
           super__List_node_base._M_next;
  if (p_Var1 != (_List_node_base *)t) {
    __first._M_node =
         (((_List_base<unsigned_int,_std::allocator<unsigned_int>_> *)&p_Var1->_M_next)->_M_impl).
         _M_node.super__List_node_base._M_next;
    output_unsigned<unsigned_int>(s,(uint *)(p_Var1 + 1),8);
    std::
    for_each<std::_List_const_iterator<unsigned_int>,UnitTests::stream_any_details::output_range_or_type<std::__cxx11::list<unsigned_int,std::allocator<unsigned_int>>>(std::ostream&,std::__cxx11::list<unsigned_int,std::allocator<unsigned_int>>const&,std::integral_constant<bool,true>const&)::_lambda(auto:1_const&)_1_>
              (__first,(_List_const_iterator<unsigned_int>)t,(anon_class_8_1_54a39813)s);
  }
  std::__ostream_insert<char,std::char_traits<char>>(s,"]",1);
  return;
}

Assistant:

void output_range_or_type(std::ostream& s, const T& t, const std::true_type& /*unused*/)
        {
            s << "[";
            if (begin(t) != end(t))
            {
                auto first = begin(t);
                s << stream_any(*first++);
                std::for_each(first, end(t), [&s](const auto& value) { s << ", " << stream_any(value); });
            }
            s << "]";
        }